

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-rand.c
# Opt level: O2

int damroll(int num,int sides)

{
  uint32_t uVar1;
  int iVar2;
  bool bVar3;
  
  if (sides < 1) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    if (num < 1) {
      num = 0;
      iVar2 = 0;
    }
    while (bVar3 = num != 0, num = num + -1, bVar3) {
      uVar1 = Rand_div(sides);
      iVar2 = iVar2 + uVar1 + 1;
    }
  }
  return iVar2;
}

Assistant:

int damroll(int num, int sides)
{
	int i;
	int sum = 0;

	if (sides <= 0) return 0;

	for (i = 0; i < num; i++)
		sum += randint1(sides);
	return sum;
}